

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

char ** hts_idx_seqnames(hts_idx_t *idx,int *n,hts_id2name_f getid,void *hdr)

{
  char *pcVar1;
  bidx_t *bidx;
  char **names;
  int i;
  int tid;
  void *hdr_local;
  hts_id2name_f getid_local;
  int *n_local;
  hts_idx_t *idx_local;
  
  if (idx->n == 0) {
    *n = 0;
    idx_local = (hts_idx_t *)0x0;
  }
  else {
    names._4_4_ = 0;
    idx_local = (hts_idx_t *)calloc((long)idx->n,8);
    for (names._0_4_ = 0; (int)names < idx->n; names._0_4_ = (int)names + 1) {
      if (idx->bidx[(int)names] != (bidx_t *)0x0) {
        pcVar1 = (*getid)(hdr,(int)names);
        *(char **)(&idx_local->fmt + (long)names._4_4_ * 2) = pcVar1;
        names._4_4_ = names._4_4_ + 1;
      }
    }
    *n = names._4_4_;
  }
  return (char **)idx_local;
}

Assistant:

const char **hts_idx_seqnames(const hts_idx_t *idx, int *n, hts_id2name_f getid, void *hdr)
{
    if ( !idx->n )
    {
        *n = 0;
        return NULL;
    }

    int tid = 0, i;
    const char **names = (const char**) calloc(idx->n,sizeof(const char*));
    for (i=0; i<idx->n; i++)
    {
        bidx_t *bidx = idx->bidx[i];
        if ( !bidx ) continue;
        names[tid++] = getid(hdr,i);
    }
    *n = tid;
    return names;
}